

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cecCorr.c
# Opt level: O1

void Cec_ManStartSimInfo(Vec_Ptr_t *vInfo,int nFlops)

{
  void **ppvVar1;
  void *pvVar2;
  void *pvVar3;
  uint uVar4;
  ulong uVar5;
  uint uVar6;
  ulong uVar7;
  
  if (1 < vInfo->nSize) {
    if (vInfo->nSize < nFlops) {
      __assert_fail("nFlops <= Vec_PtrSize(vInfo)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/cec/cecCorr.c"
                    ,0x129,"void Cec_ManStartSimInfo(Vec_Ptr_t *, int)");
    }
    ppvVar1 = vInfo->pArray;
    pvVar2 = ppvVar1[1];
    pvVar3 = *ppvVar1;
    uVar7 = (ulong)(uint)nFlops;
    uVar6 = (uint)((ulong)((long)pvVar2 - (long)pvVar3) >> 2);
    if (0 < nFlops) {
      uVar5 = 0;
      do {
        if ((long)vInfo->nSize <= (long)uVar5) goto LAB_005a5c09;
        if (0 < (int)uVar6) {
          memset(ppvVar1[uVar5],0,(long)pvVar2 - (long)pvVar3 & 0x3fffffffc);
        }
        uVar5 = uVar5 + 1;
      } while (uVar7 != uVar5);
    }
    if (nFlops < vInfo->nSize) {
      do {
        if (nFlops < 0) goto LAB_005a5c09;
        if (0 < (int)uVar6) {
          pvVar2 = vInfo->pArray[uVar7];
          uVar5 = 0;
          do {
            uVar4 = Gia_ManRandom(0);
            *(uint *)((long)pvVar2 + uVar5 * 4) = uVar4;
            uVar5 = uVar5 + 1;
          } while ((uVar6 & 0x7fffffff) != uVar5);
        }
        uVar7 = uVar7 + 1;
      } while ((int)uVar7 < vInfo->nSize);
    }
    return;
  }
LAB_005a5c09:
  __assert_fail("i >= 0 && i < p->nSize",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecPtr.h"
                ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
}

Assistant:

void Cec_ManStartSimInfo( Vec_Ptr_t * vInfo, int nFlops )
{
    unsigned * pInfo;
    int k, w, nWords;
    nWords = Vec_PtrReadWordsSimInfo( vInfo );
    assert( nFlops <= Vec_PtrSize(vInfo) );
    for ( k = 0; k < nFlops; k++ )
    {
        pInfo = (unsigned *)Vec_PtrEntry( vInfo, k );
        for ( w = 0; w < nWords; w++ )
            pInfo[w] = 0;
    }
    for ( k = nFlops; k < Vec_PtrSize(vInfo); k++ )
    {
        pInfo = (unsigned *)Vec_PtrEntry( vInfo, k );
        for ( w = 0; w < nWords; w++ )
            pInfo[w] = Gia_ManRandom( 0 );
    }
}